

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937.cc
# Opt level: O0

void __thiscall trng::mt19937::seed(mt19937 *this,unsigned_long s)

{
  unsigned_long s_local;
  mt19937 *this_local;
  
  (this->S).mt[0] = (result_type)s;
  (this->S).mti = 1;
  while ((this->S).mti < 0x270) {
    (this->S).mt[(this->S).mti] =
         ((this->S).mt[(this->S).mti + -1] ^ (this->S).mt[(this->S).mti + -1] >> 0x1e) * 0x6c078965
         + (this->S).mti;
    (this->S).mti = (this->S).mti + 1;
  }
  return;
}

Assistant:

void mt19937::seed(unsigned long s) {
    S.mt[0] = s & 0xffffffffU;
    for (S.mti = 1; S.mti < mt19937::N; ++S.mti)
      S.mt[S.mti] =
          (1812433253U * (S.mt[S.mti - 1] ^ (S.mt[S.mti - 1] >> 30u)) + S.mti) & 0xffffffffU;
  }